

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopl3.cpp
# Opt level: O0

void __thiscall NukedOPL3::WriteReg(NukedOPL3 *this,int reg,int v)

{
  byte bVar1;
  uint uVar2;
  byte data;
  char cStack_14;
  byte bStack_13;
  Bit8u regm;
  Bit8u high;
  int v_local;
  int reg_local;
  NukedOPL3 *this_local;
  
  bStack_13 = (byte)((reg & 0x1ffU) >> 8);
  cStack_14 = (char)(reg & 0x1ffU);
  uVar2 = reg & 0xf0;
  bVar1 = (byte)((int)(v & 0xffU) >> 6);
  data = (byte)v;
  if ((reg & 0xf0U) == 0) {
    if (bStack_13 == 0) {
      if ((reg & 0xfU) == 8) {
        (this->opl3).nts = bVar1 & 1;
      }
    }
    else if ((reg & 0xfU) == 4) {
      chan_set4op(&this->opl3,data);
    }
    else if ((reg & 0xfU) == 5) {
      (this->opl3).newm = data & 1;
    }
  }
  else if ((uVar2 == 0x20) || (uVar2 == 0x30)) {
    if (-1 < ""[(int)(reg & 0x1f)]) {
      slot_write20((this->opl3).slot + (int)((uint)bStack_13 * 0x12 + (int)""[(int)(reg & 0x1f)]),
                   data);
    }
  }
  else if ((uVar2 == 0x40) || (uVar2 == 0x50)) {
    if (-1 < ""[(int)(reg & 0x1f)]) {
      slot_write40((this->opl3).slot + (int)((uint)bStack_13 * 0x12 + (int)""[(int)(reg & 0x1f)]),
                   data);
    }
  }
  else if ((uVar2 == 0x60) || (uVar2 == 0x70)) {
    if (-1 < ""[(int)(reg & 0x1f)]) {
      slot_write60((this->opl3).slot + (int)((uint)bStack_13 * 0x12 + (int)""[(int)(reg & 0x1f)]),
                   data);
    }
  }
  else if ((uVar2 == 0x80) || (uVar2 == 0x90)) {
    if (-1 < ""[(int)(reg & 0x1f)]) {
      slot_write80((this->opl3).slot + (int)((uint)bStack_13 * 0x12 + (int)""[(int)(reg & 0x1f)]),
                   data);
    }
  }
  else if (uVar2 == 0xa0) {
    if ((reg & 0xfU) < 9) {
      chan_writea0((this->opl3).channel + (int)((uint)bStack_13 * 9 + (reg & 0xfU)),data);
    }
  }
  else if (uVar2 == 0xb0) {
    if ((cStack_14 == -0x43) && (bStack_13 == 0)) {
      (this->opl3).dam = (Bit8u)((int)(v & 0xffU) >> 7);
      (this->opl3).dvb = bVar1 & 1;
      chan_updaterhythm(&this->opl3,data);
    }
    else if ((reg & 0xfU) < 9) {
      chan_writeb0((this->opl3).channel + (int)((uint)bStack_13 * 9 + (reg & 0xfU)),data);
      if ((v & 0x20U) == 0) {
        chan_disable((this->opl3).channel + (int)((uint)bStack_13 * 9 + (reg & 0xfU)));
      }
      else {
        chan_enable((this->opl3).channel + (int)((uint)bStack_13 * 9 + (reg & 0xfU)));
      }
    }
  }
  else if (uVar2 == 0xc0) {
    if ((reg & 0xfU) < 9) {
      chan_writec0((this->opl3).channel + (int)((uint)bStack_13 * 9 + (reg & 0xfU)),data);
    }
  }
  else if (((uVar2 == 0xe0) || (uVar2 == 0xf0)) && (-1 < ""[(int)(reg & 0x1f)])) {
    slot_writee0((this->opl3).slot + (int)((uint)bStack_13 * 0x12 + (int)""[(int)(reg & 0x1f)]),data
                );
  }
  return;
}

Assistant:

void NukedOPL3::WriteReg(int reg, int v) {
	v &= 0xff;
	reg &= 0x1ff;
	Bit8u high = (reg >> 8) & 0x01;
	Bit8u regm = reg & 0xff;
	switch (regm & 0xf0) {
	case 0x00:
		if (high) {
			switch (regm & 0x0f) {
			case 0x04:
				chan_set4op(&opl3, v);
				break;
			case 0x05:
				opl3.newm = v & 0x01;
				break;
			}
		}
		else {
			switch (regm & 0x0f) {
			case 0x08:
				opl3.nts = (v >> 6) & 0x01;
				break;
			}
		}
		break;
	case 0x20:
	case 0x30:
		if (ad_slot[regm & 0x1f] >= 0) {
			slot_write20(&opl3.slot[18 * high + ad_slot[regm & 0x1f]], v);
		}
		break;
	case 0x40:
	case 0x50:
		if (ad_slot[regm & 0x1f] >= 0) {
			slot_write40(&opl3.slot[18 * high + ad_slot[regm & 0x1f]], v);
		}
		break;
	case 0x60:
	case 0x70:
		if (ad_slot[regm & 0x1f] >= 0) {
			slot_write60(&opl3.slot[18 * high + ad_slot[regm & 0x1f]], v);
		}
		break;
	case 0x80:
	case 0x90:
		if (ad_slot[regm & 0x1f] >= 0) {
			slot_write80(&opl3.slot[18 * high + ad_slot[regm & 0x1f]], v);;
		}
		break;
	case 0xe0:
	case 0xf0:
		if (ad_slot[regm & 0x1f] >= 0) {
			slot_writee0(&opl3.slot[18 * high + ad_slot[regm & 0x1f]], v);
		}
		break;
	case 0xa0:
		if ((regm & 0x0f) < 9) {
			chan_writea0(&opl3.channel[9 * high + (regm & 0x0f)], v);
		}
		break;
	case 0xb0:
		if (regm == 0xbd && !high) {
			opl3.dam = v >> 7;
			opl3.dvb = (v >> 6) & 0x01;
			chan_updaterhythm(&opl3, v);
		}
		else if ((regm & 0x0f) < 9) {
			chan_writeb0(&opl3.channel[9 * high + (regm & 0x0f)], v);
			if (v & 0x20) {
				chan_enable(&opl3.channel[9 * high + (regm & 0x0f)]);
			}
			else {
				chan_disable(&opl3.channel[9 * high + (regm & 0x0f)]);
			}
		}
		break;
	case 0xc0:
		if ((regm & 0x0f) < 9) {
			chan_writec0(&opl3.channel[9 * high + (regm & 0x0f)], v);
		}
		break;
	}
}